

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  undefined8 ridx_00;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  v = (cpp_dec_float<50U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  vSolveLright2(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8);
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    if (rn < 1) {
      uVar13 = 0;
    }
    else {
      piVar5 = (this->row).perm;
      lVar14 = 0;
      uVar13 = 0;
      do {
        iVar8 = ridx[lVar14];
        result.m_backend.exp = rhs[iVar8].m_backend.exp;
        result.m_backend.neg = rhs[iVar8].m_backend.neg;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        result.m_backend.fpclass = rhs[iVar8].m_backend.fpclass;
        result.m_backend.prec_elem = rhs[iVar8].m_backend.prec_elem;
        local_228.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_228.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_228.exp = (eps->m_backend).exp;
        local_228.neg = (eps->m_backend).neg;
        local_228.fpclass = (eps->m_backend).fpclass;
        local_228.prec_elem = (eps->m_backend).prec_elem;
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        if ((local_228.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN
            ) || (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&result.m_backend,&local_228), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          iVar8 = piVar5[iVar8];
          uVar11 = uVar13;
          if (0 < (int)uVar13) {
            do {
              uVar10 = uVar11 - 1;
              uVar15 = uVar10 >> 1;
              if (iVar8 <= ridx[uVar15]) break;
              ridx[uVar11] = ridx[uVar15];
              uVar11 = uVar15;
            } while (1 < uVar10);
          }
          uVar13 = uVar13 + 1;
          ridx[(int)uVar11] = iVar8;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < rn);
    }
  }
  else {
    if (rn < 1) {
      uVar13 = 0;
    }
    else {
      local_270 = (int *)eps2.m_backend._48_8_;
      piVar5 = (this->row).perm;
      lVar14 = 0;
      uVar13 = 0;
      do {
        iVar8 = ridx[lVar14];
        lVar16 = (long)iVar8;
        lVar17 = lVar16 * 0x38;
        result_2.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar16].m_backend.data._M_elems + 8);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar16].m_backend.data._M_elems;
        result_2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[lVar16].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar16].m_backend.data._M_elems + 4;
        result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result_2.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        iVar7 = rhs[lVar16].m_backend.exp;
        bVar2 = rhs[lVar16].m_backend.neg;
        fVar3 = rhs[lVar16].m_backend.fpclass;
        iVar4 = rhs[lVar16].m_backend.prec_elem;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar16].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar16].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[lVar16].m_backend.data._M_elems + 2);
        puVar1 = rhs[lVar16].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_1e8.exp = (eps->m_backend).exp;
        local_1e8.neg = (eps->m_backend).neg;
        local_1e8.fpclass = (eps->m_backend).fpclass;
        local_1e8.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.prec_elem = iVar4;
        result.m_backend.fpclass = fVar3;
        result.m_backend.neg = bVar2;
        if ((bVar2 == true) &&
           (result.m_backend.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar7;
        if ((local_1e8.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&result.m_backend,&local_1e8), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[lVar16].m_backend,0);
        }
        else {
          *local_270 = iVar8;
          iVar8 = piVar5[lVar16];
          uVar11 = uVar13;
          if (0 < (int)uVar13) {
            do {
              uVar10 = uVar11 - 1;
              uVar15 = uVar10 >> 1;
              if (iVar8 <= ridx[uVar15]) break;
              ridx[uVar11] = ridx[uVar15];
              uVar11 = uVar15;
            } while (1 < uVar10);
          }
          local_270 = local_270 + 1;
          uVar13 = uVar13 + 1;
          ridx[(int)uVar11] = iVar8;
          *(undefined8 *)(eps2.m_backend.data._M_elems._32_8_ + 0x20 + lVar17) =
               result_2.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x10 + lVar17);
          *(undefined8 *)puVar1 = result_2.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = result_2.m_backend.data._M_elems._24_8_;
          *(undefined8 *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) =
               result_2.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar17) + 2) =
               result_2.m_backend.data._M_elems._8_8_;
          *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x28 + lVar17) = iVar7;
          *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x2c + lVar17) = bVar2;
          *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x30 + lVar17) = fVar3;
          *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x34 + lVar17) = iVar4;
        }
        lVar14 = lVar14 + 1;
        v = (cpp_dec_float<50U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
      } while (lVar14 < rn);
    }
    *(uint *)eps2.m_backend._40_8_ = uVar13;
  }
  rn = uVar13;
  if ((double)this->thedim * 0.2 < (double)(int)eps2.m_backend.data._M_elems[6]) {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = this->thedim + -1;
    uVar13 = eps2.m_backend.data._M_elems[6];
  }
  else if ((int)eps2.m_backend.data._M_elems[6] < 1) {
    uVar13 = 0;
  }
  else {
    piVar5 = (this->row).perm;
    lVar14 = 0;
    uVar12 = 0;
    do {
      uVar13 = (uint)uVar12;
      lVar16 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar14 * 4);
      lVar17 = lVar16 * 0x38;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar17);
      result.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + lVar17);
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._8_8_ + lVar17) + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar17);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar17);
      result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar17);
      result.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar17);
      result_2.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
      result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
      result_2.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
      result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
      result_2.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
      result_2.m_backend.exp = v->exp;
      result_2.m_backend.neg = v->neg;
      uVar9._0_4_ = v->fpclass;
      uVar9._4_4_ = v->prec_elem;
      if (result_2.m_backend.data._M_elems[0] != 0 || (undefined4)uVar9 != 0) {
        result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
      }
      result_2.m_backend._48_8_ = uVar9;
      uVar11 = uVar13;
      if (result.m_backend.fpclass == cpp_dec_float_NaN || (undefined4)uVar9 == 2) {
LAB_002accab:
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) && ((int)uVar9 != 2)) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&result.m_backend,v), 0 < iVar8)) {
          iVar8 = piVar5[lVar16];
          if (0 < (int)uVar13) {
            do {
              uVar15 = (uint)uVar12 - 1;
              uVar10 = uVar15 >> 1;
              iVar7 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
              uVar11 = (uint)uVar12;
              if (iVar8 <= iVar7) break;
              *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar7;
              uVar12 = (ulong)uVar10;
              uVar11 = uVar10;
            } while (1 < uVar15);
          }
          goto LAB_002acd50;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar17 + eps2.m_backend.data._M_elems._8_8_),0)
        ;
      }
      else {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&result.m_backend,&result_2.m_backend);
        if (-1 < iVar8) {
          uVar9 = (ulong)v->fpclass;
          goto LAB_002accab;
        }
        iVar8 = piVar5[lVar16];
        if (0 < (int)uVar13) {
          do {
            uVar15 = (uint)uVar12 - 1;
            uVar10 = uVar15 >> 1;
            iVar7 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar10 * 4);
            uVar11 = (uint)uVar12;
            if (iVar8 <= iVar7) break;
            *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar7;
            uVar12 = (ulong)uVar10;
            uVar11 = uVar10;
          } while (1 < uVar15);
        }
LAB_002acd50:
        uVar12 = (ulong)(uVar13 + 1);
        *(int *)(eps2.m_backend.data._M_elems._16_8_ + (long)(int)uVar11 * 4) = iVar8;
      }
      lVar14 = lVar14 + 1;
      uVar13 = (uint)uVar12;
    } while (lVar14 < (int)eps2.m_backend.data._M_elems[6]);
  }
  eps2.m_backend.data._M_elems[6] = uVar13;
  ridx_00 = eps2.m_backend.data._M_elems._16_8_;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (eps->m_backend).exp;
  local_e8.m_backend.neg = (eps->m_backend).neg;
  local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(this,vec,idx,rhs,ridx,rn,&local_e8);
  vec_00 = vec2;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
  local_128.m_backend.exp = v->exp;
  local_128.m_backend.neg = v->neg;
  local_128.m_backend.fpclass = v->fpclass;
  local_128.m_backend.prec_elem = v->prec_elem;
  vSolveUrightNoNZ(this,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)ridx_00,
                   eps2.m_backend.data._M_elems[6],&local_128);
  if ((this->l).updateType == 0) {
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_168.m_backend.exp = (eps->m_backend).exp;
    local_168.m_backend.neg = (eps->m_backend).neg;
    local_168.m_backend.fpclass = (eps->m_backend).fpclass;
    local_168.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,idx,rn,&local_168);
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
    local_1a8.m_backend.exp = v->exp;
    local_1a8.m_backend.neg = v->neg;
    local_1a8.m_backend.fpclass = v->fpclass;
    local_1a8.m_backend.prec_elem = v->prec_elem;
    vSolveUpdateRightNoNZ(this,vec_00,&local_1a8);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}